

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picosha2.h
# Opt level: O0

void picosha2::impl::
     hash256_impl<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_char*>
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                first,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      last,uchar *first2,uchar *last2,undefined4 param_5)

{
  undefined1 local_b0 [8];
  hash256_one_by_one hasher;
  int param_4_local;
  uchar *last2_local;
  uchar *first2_local;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  last_local;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  first_local;
  
  hasher.h_[7]._4_4_ = param_5;
  hash256_one_by_one::hash256_one_by_one((hash256_one_by_one *)local_b0);
  hash256_one_by_one::process<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            ((hash256_one_by_one *)local_b0,first,last);
  hash256_one_by_one::finish((hash256_one_by_one *)local_b0);
  hash256_one_by_one::get_hash_bytes<unsigned_char*>((hash256_one_by_one *)local_b0,first2,last2);
  hash256_one_by_one::~hash256_one_by_one((hash256_one_by_one *)local_b0);
  return;
}

Assistant:

void hash256_impl(RaIter first, RaIter last, OutIter first2, OutIter last2, int,
                  std::random_access_iterator_tag) {
    hash256_one_by_one hasher;
    // hasher.init();
    hasher.process(first, last);
    hasher.finish();
    hasher.get_hash_bytes(first2, last2);
}